

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O2

void __thiscall bgui::BaseWindow::setInfoText(BaseWindow *this,char *text)

{
  BaseWindowData *pBVar1;
  
  if ((*text == '\0') && ((this->p->text)._M_string_length == 0)) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
  pBVar1 = this->p;
  XPutImage(pBVar1->display,pBVar1->window,pBVar1->gc,pBVar1->image,0,0,0,0,pBVar1->w,pBVar1->h);
  std::__cxx11::string::assign((char *)&this->p->text);
  anon_unknown_0::drawInfoText(this->p);
  pthread_mutex_unlock((pthread_mutex_t *)&this->p->mutex);
  return;
}

Assistant:

void BaseWindow::setInfoText(const char *text)
{
  if (strlen(text) == 0 && p->text.size() == 0)
  {
    return;
  }

  pthread_mutex_lock(&(p->mutex));

  // clear completely

  XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h);

  // store text

  p->text=text;

  // draw text

  drawInfoText(p);

  pthread_mutex_unlock(&(p->mutex));
}